

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampleapp.cpp
# Opt level: O2

void __thiscall SampleApp::SampleApp(SampleApp *this,int *argc,char **argv)

{
  QArrayDataPointer<char16_t> QStack_28;
  
  QApplication::QApplication(&this->super_QApplication,argc,argv,0x60204);
  *(undefined ***)this = &PTR_metaObject_00106ce0;
  QString::QString((QString *)&QStack_28,"Sample App");
  QCoreApplication::setApplicationName((QString *)&QStack_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
  QString::QString((QString *)&QStack_28,"0.1");
  QCoreApplication::setApplicationVersion((QString *)&QStack_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
  return;
}

Assistant:

SampleApp::SampleApp(int &argc, char *argv[]) :
    QApplication(argc, argv)
{
    setApplicationName("Sample App");
    setApplicationVersion("0.1");
}